

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int pack_particle_slice(int left,int width,vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int iVar1;
  int k;
  int j;
  size_t p_index;
  size_t pn_index;
  size_t local_40 [2];
  
  local_40[1] = 0;
  local_40[0] = 0;
  if (0 < width) {
    iVar1 = width + left;
    do {
      if (0 < ny_global) {
        j = 0;
        do {
          if (0 < nz_global) {
            k = 0;
            do {
              pack_cell(left,j,k,particle_numbers,local_40 + 1,particles,local_40);
              k = k + 1;
            } while (k < nz_global);
          }
          j = j + 1;
        } while (j < ny_global);
      }
      left = left + 1;
    } while (left < iVar1);
  }
  return (int)local_40[0];
}

Assistant:

int pack_particle_slice(int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(i, j, k, particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}